

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.h
# Opt level: O0

void __thiscall cmCacheManager::CacheEntry::CacheEntry(CacheEntry *this)

{
  allocator local_11;
  CacheEntry *local_10;
  CacheEntry *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  this->Type = UNINITIALIZED;
  cmPropertyMap::cmPropertyMap(&this->Properties);
  this->Initialized = false;
  return;
}

Assistant:

CacheEntry()
      : Value("")
      , Type(cmStateEnums::UNINITIALIZED)
      , Initialized(false)
    {
    }